

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINPrintAllStats(void *kinmem,FILE *outfile,SUNOutputFormat fmt)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar2 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x43e;
  }
  else {
    if (fmt == SUN_OUTPUTFORMAT_CSV) {
      fprintf((FILE *)outfile,"Nonlinear iters,%li",*(undefined8 *)((long)kinmem + 0xd0));
      fprintf((FILE *)outfile,",Nonlinear fn evals,%li",*(undefined8 *)((long)kinmem + 0xd8));
      fprintf((FILE *)outfile,",Beta condition fails,%li",*(undefined8 *)((long)kinmem + 0xf0));
      fprintf((FILE *)outfile,",Backtrack operations,%li",*(undefined8 *)((long)kinmem + 0xf8));
      fprintf((FILE *)outfile,",Nonlinear fn norm,%.16g",*(undefined8 *)((long)kinmem + 0x250));
      fprintf((FILE *)outfile,",Step length,%.16g",*(undefined8 *)((long)kinmem + 0x90));
      lVar1 = *(long *)((long)kinmem + 0x248);
      if (lVar1 != 0) {
        fprintf((FILE *)outfile,",Jac fn evals,%ld",*(undefined8 *)(lVar1 + 0x38));
        fprintf((FILE *)outfile,",LS Nonlinear fn evals,%ld",*(undefined8 *)(lVar1 + 0x40));
        fprintf((FILE *)outfile,",Prec setup evals,%ld",*(undefined8 *)(lVar1 + 0x48));
        fprintf((FILE *)outfile,",Prec solves,%ld",*(undefined8 *)(lVar1 + 0x58));
        fprintf((FILE *)outfile,",LS iters,%ld",*(undefined8 *)(lVar1 + 0x50));
        fprintf((FILE *)outfile,",LS fails,%ld",*(undefined8 *)(lVar1 + 0x60));
        fprintf((FILE *)outfile,",Jac-times evals,%ld",*(undefined8 *)(lVar1 + 0x68));
        if (*(long *)((long)kinmem + 0xd0) < 1) {
          fwrite(",LS iters per NLS iter,0",0x18,1,(FILE *)outfile);
          fwrite(",Jac evals per NLS iter,0",0x19,1,(FILE *)outfile);
          fwrite(",Prec evals per NLS iter,0",0x1a,1,(FILE *)outfile);
        }
        else {
          fprintf((FILE *)outfile,",LS iters per NLS iter,%.16g",
                  (double)*(long *)(lVar1 + 0x50) / (double)*(long *)((long)kinmem + 0xd0));
          fprintf((FILE *)outfile,",Jac evals per NLS iter,%.16g",
                  (double)*(long *)(lVar1 + 0x38) / (double)*(long *)((long)kinmem + 0xd0));
          fprintf((FILE *)outfile,",Prec evals per NLS iter,%.16g",
                  (double)*(long *)(lVar1 + 0x48) / (double)*(long *)((long)kinmem + 0xd0));
        }
      }
      fputc(10,(FILE *)outfile);
      return 0;
    }
    if (fmt == SUN_OUTPUTFORMAT_TABLE) {
      fprintf((FILE *)outfile,"Nonlinear iters         = %li\n",*(undefined8 *)((long)kinmem + 0xd0)
             );
      fprintf((FILE *)outfile,"Nonlinear fn evals      = %li\n",*(undefined8 *)((long)kinmem + 0xd8)
             );
      fprintf((FILE *)outfile,"Beta condition fails    = %li\n",*(undefined8 *)((long)kinmem + 0xf0)
             );
      fprintf((FILE *)outfile,"Backtrack operations    = %li\n",*(undefined8 *)((long)kinmem + 0xf8)
             );
      fprintf((FILE *)outfile,"Nonlinear fn norm       = %.16g\n",
              *(undefined8 *)((long)kinmem + 0x250));
      fprintf((FILE *)outfile,"Step length             = %.16g\n",
              *(undefined8 *)((long)kinmem + 0x90));
      lVar1 = *(long *)((long)kinmem + 0x248);
      if (lVar1 == 0) {
        return 0;
      }
      fprintf((FILE *)outfile,"Jac fn evals            = %ld\n",*(undefined8 *)(lVar1 + 0x38));
      fprintf((FILE *)outfile,"LS Nonlinear fn evals   = %ld\n",*(undefined8 *)(lVar1 + 0x40));
      fprintf((FILE *)outfile,"Prec setup evals        = %ld\n",*(undefined8 *)(lVar1 + 0x48));
      fprintf((FILE *)outfile,"Prec solves             = %ld\n",*(undefined8 *)(lVar1 + 0x58));
      fprintf((FILE *)outfile,"LS iters                = %ld\n",*(undefined8 *)(lVar1 + 0x50));
      fprintf((FILE *)outfile,"LS fails                = %ld\n",*(undefined8 *)(lVar1 + 0x60));
      fprintf((FILE *)outfile,"Jac-times evals         = %ld\n",*(undefined8 *)(lVar1 + 0x68));
      if (*(long *)((long)kinmem + 0xd0) < 1) {
        return 0;
      }
      fprintf((FILE *)outfile,"LS iters per NLS iter   = %.16g\n",
              (double)*(long *)(lVar1 + 0x50) / (double)*(long *)((long)kinmem + 0xd0));
      fprintf((FILE *)outfile,"Jac evals per NLS iter  = %.16g\n",
              (double)*(long *)(lVar1 + 0x38) / (double)*(long *)((long)kinmem + 0xd0));
      fprintf((FILE *)outfile,"Prec evals per NLS iter = %.16g\n",
              (double)*(long *)(lVar1 + 0x48) / (double)*(long *)((long)kinmem + 0xd0));
      return 0;
    }
    msgfmt = "Invalid formatting option.";
    iVar2 = -2;
    error_code = -2;
    line = 0x48d;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINPrintAllStats",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int KINPrintAllStats(void* kinmem, FILE* outfile, SUNOutputFormat fmt)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    /* main solver stats */
    fprintf(outfile, "Nonlinear iters         = %li\n", kin_mem->kin_nni);
    fprintf(outfile, "Nonlinear fn evals      = %li\n", kin_mem->kin_nfe);
    fprintf(outfile, "Beta condition fails    = %li\n", kin_mem->kin_nbcf);
    fprintf(outfile, "Backtrack operations    = %li\n", kin_mem->kin_nbktrk);
    fprintf(outfile, "Nonlinear fn norm       = %" RSYM "\n", kin_mem->kin_fnorm);
    fprintf(outfile, "Step length             = %" RSYM "\n", kin_mem->kin_stepl);

    /* linear solver stats */
    if (kin_mem->kin_lmem)
    {
      kinls_mem = (KINLsMem)(kin_mem->kin_lmem);
      fprintf(outfile, "Jac fn evals            = %ld\n", kinls_mem->nje);
      fprintf(outfile, "LS Nonlinear fn evals   = %ld\n", kinls_mem->nfeDQ);
      fprintf(outfile, "Prec setup evals        = %ld\n", kinls_mem->npe);
      fprintf(outfile, "Prec solves             = %ld\n", kinls_mem->nps);
      fprintf(outfile, "LS iters                = %ld\n", kinls_mem->nli);
      fprintf(outfile, "LS fails                = %ld\n", kinls_mem->ncfl);
      fprintf(outfile, "Jac-times evals         = %ld\n", kinls_mem->njtimes);
      if (kin_mem->kin_nni > 0)
      {
        fprintf(outfile, "LS iters per NLS iter   = %" RSYM "\n",
                (sunrealtype)kinls_mem->nli / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, "Jac evals per NLS iter  = %" RSYM "\n",
                (sunrealtype)kinls_mem->nje / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, "Prec evals per NLS iter = %" RSYM "\n",
                (sunrealtype)kinls_mem->npe / (sunrealtype)kin_mem->kin_nni);
      }
    }

    break;
  case SUN_OUTPUTFORMAT_CSV:
    /* main solver stats */
    fprintf(outfile, "Nonlinear iters,%li", kin_mem->kin_nni);
    fprintf(outfile, ",Nonlinear fn evals,%li", kin_mem->kin_nfe);
    fprintf(outfile, ",Beta condition fails,%li", kin_mem->kin_nbcf);
    fprintf(outfile, ",Backtrack operations,%li", kin_mem->kin_nbktrk);
    fprintf(outfile, ",Nonlinear fn norm,%" RSYM, kin_mem->kin_fnorm);
    fprintf(outfile, ",Step length,%" RSYM, kin_mem->kin_stepl);

    /* linear solver stats */
    if (kin_mem->kin_lmem)
    {
      kinls_mem = (KINLsMem)(kin_mem->kin_lmem);
      fprintf(outfile, ",Jac fn evals,%ld", kinls_mem->nje);
      fprintf(outfile, ",LS Nonlinear fn evals,%ld", kinls_mem->nfeDQ);
      fprintf(outfile, ",Prec setup evals,%ld", kinls_mem->npe);
      fprintf(outfile, ",Prec solves,%ld", kinls_mem->nps);
      fprintf(outfile, ",LS iters,%ld", kinls_mem->nli);
      fprintf(outfile, ",LS fails,%ld", kinls_mem->ncfl);
      fprintf(outfile, ",Jac-times evals,%ld", kinls_mem->njtimes);
      if (kin_mem->kin_nni > 0)
      {
        fprintf(outfile, ",LS iters per NLS iter,%" RSYM,
                (sunrealtype)kinls_mem->nli / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, ",Jac evals per NLS iter,%" RSYM,
                (sunrealtype)kinls_mem->nje / (sunrealtype)kin_mem->kin_nni);
        fprintf(outfile, ",Prec evals per NLS iter,%" RSYM,
                (sunrealtype)kinls_mem->npe / (sunrealtype)kin_mem->kin_nni);
      }
      else
      {
        fprintf(outfile, ",LS iters per NLS iter,0");
        fprintf(outfile, ",Jac evals per NLS iter,0");
        fprintf(outfile, ",Prec evals per NLS iter,0");
      }
    }
    fprintf(outfile, "\n");
    break;
  default:
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid formatting option.");
    return (KIN_ILL_INPUT);
  }

  return (KIN_SUCCESS);
}